

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

void __thiscall QMetaMethodBuilder::setReturnType(QMetaMethodBuilder *this,QByteArray *value)

{
  qsizetype qVar1;
  Data *pDVar2;
  QMetaMethodBuilderPrivate *pQVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func(this);
  if (pQVar3 != (QMetaMethodBuilderPrivate *)0x0) {
    pcVar4 = (value->d).ptr;
    if (pcVar4 == (char *)0x0) {
      pcVar4 = &QByteArray::_empty;
    }
    QMetaObject::normalizedType((QByteArray *)&local_38,pcVar4);
    pDVar2 = (pQVar3->returnType).d.d;
    pcVar4 = (pQVar3->returnType).d.ptr;
    (pQVar3->returnType).d.d = local_38.d;
    (pQVar3->returnType).d.ptr = local_38.ptr;
    qVar1 = (pQVar3->returnType).d.size;
    (pQVar3->returnType).d.size = local_38.size;
    local_38.d = pDVar2;
    local_38.ptr = pcVar4;
    local_38.size = qVar1;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMetaMethodBuilder::setReturnType(const QByteArray &value)
{
    QMetaMethodBuilderPrivate *d = d_func();
    if (d)
        d->returnType = QMetaObject::normalizedType(value);
}